

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

string * Assimp::BaseImporter::GetExtension(string *__return_storage_ptr__,string *file)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  allocator local_21;
  long local_20;
  size_type pos;
  string *file_local;
  string *ret;
  
  pos = (size_type)file;
  file_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_last_of((char)file,0x2e);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,pos);
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
              (__first,__last,__result,ToLower<char>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseImporter::GetExtension( const std::string& file ) {
    std::string::size_type pos = file.find_last_of('.');

    // no file extension at all
    if (pos == std::string::npos) {
        return "";
    }


    // thanks to Andy Maloney for the hint
    std::string ret = file.substr( pos + 1 );
    std::transform( ret.begin(), ret.end(), ret.begin(), ToLower<char>);

    return ret;
}